

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O0

void __thiscall ValueInfo::Dump(ValueInfo *this)

{
  bool bVar1;
  uint16 uVar2;
  uint uVar3;
  uint uVar4;
  ValueType *this_00;
  FloatConstantValueInfo *this_01;
  JsTypeValueInfo *pJVar5;
  JITType *this_02;
  intptr_t iVar6;
  EquivalentTypeSet *this_03;
  JITTypeHolder JVar7;
  ArrayValueInfo *this_04;
  StackSym *pSVar8;
  Sym *pSVar9;
  ArrayValueInfo *arrayValueInfo;
  ushort local_13c;
  uint16 ti;
  uint16 typeCount;
  EquivalentTypeSet *typeSet;
  JITTypeHolderBase<void> local_128;
  JITTypeHolder type;
  IntConstantBounds intConstantBounds;
  char typeStr [256];
  ValueInfo *this_local;
  
  bVar1 = IsJsType(this);
  if (!bVar1) {
    this_00 = Type(this);
    ValueType::ToString(this_00,(char (*) [256])&intConstantBounds);
    Output::Print(L"%S",&intConstantBounds);
  }
  IntConstantBounds::IntConstantBounds((IntConstantBounds *)&type);
  bVar1 = TryGetIntConstantBounds(this,(IntConstantBounds *)&type,false);
  if (bVar1) {
    bVar1 = IntConstantBounds::IsConstant((IntConstantBounds *)&type);
    if (bVar1) {
      uVar3 = IntConstantBounds::LowerBound((IntConstantBounds *)&type);
      Output::Print(L" constant:%d",(ulong)uVar3);
      return;
    }
    uVar3 = IntConstantBounds::LowerBound((IntConstantBounds *)&type);
    uVar4 = IntConstantBounds::UpperBound((IntConstantBounds *)&type);
    Output::Print(L" range:%d - %d",(ulong)uVar3,(ulong)uVar4);
  }
  else {
    bVar1 = IsFloatConstant(this);
    if (bVar1) {
      this_01 = AsFloatConstant(this);
      FloatConstantValueInfo::FloatValue(this_01);
      Output::Print(L" constant:%g");
    }
    else {
      bVar1 = IsJsType(this);
      if (bVar1) {
        pJVar5 = AsJsType(this);
        local_128.t = (Type)JsTypeValueInfo::GetJsType(pJVar5);
        typeSet = (EquivalentTypeSet *)0x0;
        bVar1 = JITTypeHolderBase<void>::operator!=(&local_128,&typeSet);
        if (bVar1) {
          this_02 = JITTypeHolderBase<void>::operator->(&local_128);
          iVar6 = JITType::GetAddr(this_02);
          Output::Print(L"type: 0x%p, ",iVar6);
        }
        else {
          Output::Print(L"type: null, ");
        }
        Output::Print(L"type Set: ");
        pJVar5 = AsJsType(this);
        this_03 = JsTypeValueInfo::GetJsTypeSet(pJVar5);
        if (this_03 == (EquivalentTypeSet *)0x0) {
          Output::Print(L"null");
        }
        else {
          uVar2 = Js::EquivalentTypeSet::GetCount(this_03);
          for (local_13c = 0; (int)(uint)local_13c < (int)(uVar2 - 1); local_13c = local_13c + 1) {
            JVar7 = Js::EquivalentTypeSet::GetType(this_03,local_13c);
            Output::Print(L"0x%p, ",JVar7.t);
          }
          JVar7 = Js::EquivalentTypeSet::GetType(this_03,uVar2 - 1);
          Output::Print(L"0x%p",JVar7.t);
        }
      }
      else {
        bVar1 = IsArrayValueInfo(this);
        if (bVar1) {
          this_04 = AsArrayValueInfo(this);
          pSVar8 = ArrayValueInfo::HeadSegmentSym(this_04);
          if (pSVar8 != (StackSym *)0x0) {
            Output::Print(L" seg: ");
            pSVar8 = ArrayValueInfo::HeadSegmentSym(this_04);
            Sym::Dump(&pSVar8->super_Sym,ValueType::Uninitialized);
          }
          pSVar8 = ArrayValueInfo::HeadSegmentLengthSym(this_04);
          if (pSVar8 != (StackSym *)0x0) {
            Output::Print(L" segLen: ");
            pSVar8 = ArrayValueInfo::HeadSegmentLengthSym(this_04);
            Sym::Dump(&pSVar8->super_Sym,ValueType::Uninitialized);
          }
          pSVar8 = ArrayValueInfo::LengthSym(this_04);
          if (pSVar8 != (StackSym *)0x0) {
            Output::Print(L" len: ");
            pSVar8 = ArrayValueInfo::LengthSym(this_04);
            Sym::Dump(&pSVar8->super_Sym,ValueType::Uninitialized);
          }
        }
      }
    }
  }
  pSVar9 = GetSymStore(this);
  if (pSVar9 != (Sym *)0x0) {
    Output::Print(L"\t\tsym:");
    pSVar9 = GetSymStore(this);
    Sym::Dump(pSVar9,ValueType::Uninitialized);
  }
  return;
}

Assistant:

void ValueInfo::Dump()
{
    if (!IsJsType()) // The value type is uninitialized for a type value
    {
        char typeStr[VALUE_TYPE_MAX_STRING_SIZE];
        Type().ToString(typeStr);
        Output::Print(_u("%S"), typeStr);
    }

    IntConstantBounds intConstantBounds;
    if (TryGetIntConstantBounds(&intConstantBounds))
    {
        if (intConstantBounds.IsConstant())
        {
            Output::Print(_u(" constant:%d"), intConstantBounds.LowerBound());
            return;
        }
        Output::Print(_u(" range:%d - %d"), intConstantBounds.LowerBound(), intConstantBounds.UpperBound());
    }
    else if (IsFloatConstant())
    {
        Output::Print(_u(" constant:%g"), AsFloatConstant()->FloatValue());
    }
    else if (IsJsType())
    {
        const JITTypeHolder type(AsJsType()->GetJsType());
        type != nullptr ? Output::Print(_u("type: 0x%p, "), type->GetAddr()) : Output::Print(_u("type: null, "));
        Output::Print(_u("type Set: "));
        Js::EquivalentTypeSet* typeSet = AsJsType()->GetJsTypeSet();
        if (typeSet != nullptr)
        {
            uint16 typeCount = typeSet->GetCount();
            for (uint16 ti = 0; ti < typeCount - 1; ti++)
            {
                Output::Print(_u("0x%p, "), typeSet->GetType(ti));
            }
            Output::Print(_u("0x%p"), typeSet->GetType(typeCount - 1));
        }
        else
        {
            Output::Print(_u("null"));
        }
    }
    else if (IsArrayValueInfo())
    {
        const ArrayValueInfo *const arrayValueInfo = AsArrayValueInfo();
        if (arrayValueInfo->HeadSegmentSym())
        {
            Output::Print(_u(" seg: "));
            arrayValueInfo->HeadSegmentSym()->Dump();
        }
        if (arrayValueInfo->HeadSegmentLengthSym())
        {
            Output::Print(_u(" segLen: "));
            arrayValueInfo->HeadSegmentLengthSym()->Dump();
        }
        if (arrayValueInfo->LengthSym())
        {
            Output::Print(_u(" len: "));
            arrayValueInfo->LengthSym()->Dump();
        }
    }

    if (this->GetSymStore())
    {
        Output::Print(_u("\t\tsym:"));
        this->GetSymStore()->Dump();
    }
}